

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O2

_Bool borg_projectable(wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2)

{
  wchar_t wVar1;
  wchar_t wVar2;
  _Bool _Var3;
  uint uVar4;
  angband_constants *paVar5;
  wchar_t x;
  wchar_t y;
  wchar_t local_38;
  wchar_t local_34;
  
  uVar4 = 0;
  paVar5 = z_info;
  x = x1;
  y = y1;
  local_38 = y1;
  local_34 = x1;
  do {
    wVar2 = y;
    wVar1 = x;
    if (paVar5->max_range < uVar4) {
      return false;
    }
    if (((borg.trait[0x1b] < borg.trait[0x1c] / 3) || (borg_morgoth_position != false)) ||
       (scaryguy_on_level == true)) {
      if (0x14 < uVar4) goto LAB_0022a660;
LAB_0022a6d2:
      if (uVar4 != 0) goto LAB_0022a6d7;
    }
    else {
      if (borg.trait[0x1c] / 2 <= borg.trait[0x1b]) {
        if ((2 < uVar4) &&
           ((int)(uint)borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb] < (int)(avoidance / 0x14)))
        goto LAB_0022a660;
        goto LAB_0022a6d2;
      }
      if (uVar4 < 0xb) goto LAB_0022a6d2;
LAB_0022a660:
      if (borg_grids[y][x].feat == '\0') {
        return false;
      }
LAB_0022a6d7:
      _Var3 = borg_cave_floor_grid(borg_grids[y] + x);
      paVar5 = z_info;
      if (!_Var3) {
        return false;
      }
    }
    if (wVar2 == y2 && wVar1 == x2) {
      return true;
    }
    borg_inc_motion(&y,&x,local_38,local_34,y2,x2);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool borg_projectable(int y1, int x1, int y2, int x2)
{
    int dist, y, x;

    borg_grid *ag;

    /* Start at the initial location */
    y = y1;
    x = x1;

    /* Simulate the spell/missile path */
    for (dist = 0; dist <= z_info->max_range; dist++) {
        /* Get the grid */
        ag = &borg_grids[y][x];

        if ((borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 3
                || borg_morgoth_position || scaryguy_on_level)) {
            /* Assume all unknown grids more than distance 20 from you
             * are walls--when I am wounded. This will make me more fearful
             * of the grids that are up to 19 spaces away.  I treat them as
             * regular floor grids.  Which means monsters are assumed to have
             * LOS on me.  I am also more likely to shoot into the dark grids.
             */
            if ((dist > 20) && (ag->feat == FEAT_NONE))
                break;
        } else if (borg.trait[BI_CURHP] < borg.trait[BI_MAXHP] / 2) {
            /* Assume all unknow grids more than distance 10 from you
             * are walls--when I am wounded. This will make me more fearful
             * of the grids that are up to 9 spaces away.  I treat them as
             * regular floor grids.
             */
            if ((dist > 10) && (ag->feat == FEAT_NONE))
                break;
        } else if (borg_fear_region[borg.c.y / 11][borg.c.x / 11]
                   >= avoidance / 20) {
            /* If a non-LOS monster is attacking me, then it is probably has
             * LOS to me, so do not place walls on unknown grids.  This will
             *allow me the chance to attack monsters.
             *
             * This does not work if the non-LOS monster is invisible.
             * This helps in a case like this:
             *####################			1.  Player has ESP and can sense the
             *priest.
             *......@......      p			2.  Priest has cast a spell at the
             *player.
             *#############					3.  Unknown grids are between player and
             *priest
             *								4.  Borg has created regional fear from non-LOS
             *priest.
             *
             */
            if ((dist > z_info->max_range) && (ag->feat == FEAT_NONE))
                break;
        } else {
            /* Assume all unknow grids more than distance 3 from you
             * are walls.  This makes me brave and chancey.
             */
            if ((dist > 2) && (ag->feat == FEAT_NONE))
                break;
        }
        /* Never pass through walls/doors */
        if (dist && (!borg_cave_floor_grid(ag)))
            break;

        /* Check for arrival at "final target" */
        if ((x == x2) && (y == y2))
            return true;

        /* Calculate the new location */
        borg_inc_motion(&y, &x, y1, x1, y2, x2);
    }

    /* Assume obstruction */
    return false;
}